

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O1

void __thiscall icu_63::SkippedState::setFirstSkipped(SkippedState *this,UChar32 c)

{
  short sVar1;
  int32_t _length;
  
  this->skipLengthAtMatch = 0;
  UnicodeString::unBogus(&this->newBuffer);
  sVar1 = (this->newBuffer).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    _length = (this->newBuffer).fUnion.fFields.fLength;
  }
  else {
    _length = (int)sVar1 >> 5;
  }
  UnicodeString::replace(&this->newBuffer,0,_length,c);
  return;
}

Assistant:

void setFirstSkipped(UChar32 c) {
        skipLengthAtMatch = 0;
        newBuffer.setTo(c);
    }